

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O0

Mat * __thiscall ncnn::ModelBinFromDataReader::load(ModelBinFromDataReader *this,int w,int type)

{
  bool bVar1;
  unsigned_short *puVar2;
  char *pcVar3;
  void *pvVar4;
  uchar *puVar5;
  byte *pbVar6;
  long lVar7;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  Mat *in_RDI;
  size_t nread_1;
  Mat m_3;
  int i;
  float *ptr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> index_array;
  size_t align_weight_data_size;
  float quantization_value [256];
  Mat m;
  Mat m_2;
  vector<signed_char,_std::allocator<signed_char>_> int8_weights;
  size_t align_data_size_1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> float16_weights;
  size_t align_data_size;
  uint flag;
  anon_union_4_2_77b30072 flag_struct;
  size_t nread;
  Mat *m_1;
  Allocator *in_stack_fffffffffffff978;
  Mat *in_stack_fffffffffffff980;
  undefined8 in_stack_fffffffffffff988;
  int _w;
  long *plVar8;
  Mat *in_stack_fffffffffffff990;
  size_type in_stack_fffffffffffff998;
  undefined7 in_stack_fffffffffffff9a0;
  undefined1 in_stack_fffffffffffff9a7;
  undefined8 in_stack_fffffffffffff9b0;
  int size;
  unsigned_short *in_stack_fffffffffffff9b8;
  Mat local_578;
  int local_534;
  float *local_530;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_528;
  size_t local_510;
  float local_508 [258];
  Mat local_100;
  Mat local_c0;
  undefined1 local_79;
  size_t local_60;
  int local_58;
  size_t local_30;
  int local_28;
  uint local_24;
  size_t local_20;
  int local_14;
  
  size = (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20);
  _w = (int)((ulong)in_stack_fffffffffffff988 >> 0x20);
  local_14 = in_EDX;
  if (in_ECX != 0) {
    if (in_ECX == 1) {
      ncnn::Mat::Mat(in_stack_fffffffffffff990,_w,(size_t)in_stack_fffffffffffff980,
                     in_stack_fffffffffffff978);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff980);
      if (bVar1) {
        ncnn::Mat::Mat(in_RDI,&local_578);
      }
      else {
        plVar8 = *(long **)(in_RSI + 8);
        pvVar4 = ncnn::Mat::operator_cast_to_void_(&local_578);
        lVar7 = (**(code **)(*plVar8 + 0x18))(plVar8,pvVar4,(long)local_14 << 2);
        if (lVar7 == (long)local_14 * 4) {
          ncnn::Mat::Mat(in_RDI,&local_578);
        }
        else {
          fprintf(_stderr,"ModelBin read weight_data failed %zd",lVar7);
          fprintf(_stderr,"\n");
          ncnn::Mat::Mat(in_RDI);
        }
      }
      local_58 = 1;
      ncnn::Mat::~Mat((Mat *)0x1664bf);
      return in_RDI;
    }
    fprintf(_stderr,"ModelBin load type %d not implemented",(ulong)in_ECX);
    fprintf(_stderr,"\n");
    ncnn::Mat::Mat(in_RDI);
    return in_RDI;
  }
  local_20 = (**(code **)(**(long **)(in_RSI + 8) + 0x18))(*(long **)(in_RSI + 8),&local_24,4);
  if (local_20 != 4) {
    fprintf(_stderr,"ModelBin read flag_struct failed %zd",local_20);
    fprintf(_stderr,"\n");
    ncnn::Mat::Mat(in_RDI);
    return in_RDI;
  }
  local_28 = (local_24 & 0xff) + (local_24 >> 8 & 0xff) + (local_24 >> 0x10 & 0xff) +
             (local_24 >> 0x18);
  if (local_24 == 0x1306b47) {
    local_30 = ncnn::alignSize((long)local_14 * 2,4);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x1659c4);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0),
               in_stack_fffffffffffff998);
    plVar8 = *(long **)(in_RSI + 8);
    puVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x1659fc);
    local_20 = (**(code **)(*plVar8 + 0x18))(plVar8,puVar2,local_30);
    if (local_20 == local_30) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x165acf);
      ncnn::Mat::from_float16(in_stack_fffffffffffff9b8,size);
    }
    else {
      fprintf(_stderr,"ModelBin read float16_weights failed %zd",local_20);
      fprintf(_stderr,"\n");
      ncnn::Mat::Mat(in_RDI);
    }
    local_58 = 1;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffff990)
    ;
    return in_RDI;
  }
  if (local_24 == 0xd4b38) {
    local_60 = ncnn::alignSize((long)local_14,4);
    std::vector<signed_char,_std::allocator<signed_char>_>::vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)0x165b45);
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              ((vector<signed_char,_std::allocator<signed_char>_> *)
               CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0),
               in_stack_fffffffffffff998);
    plVar8 = *(long **)(in_RSI + 8);
    pcVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                       ((vector<signed_char,_std::allocator<signed_char>_> *)0x165b7d);
    local_20 = (**(code **)(*plVar8 + 0x18))(plVar8,pcVar3,local_60);
    if (local_20 == local_60) {
      local_79 = 0;
      ncnn::Mat::Mat(in_stack_fffffffffffff990,_w,(size_t)in_stack_fffffffffffff980,
                     in_stack_fffffffffffff978);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff980);
      if (!bVar1) {
        pvVar4 = in_RDI->data;
        pcVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                           ((vector<signed_char,_std::allocator<signed_char>_> *)0x165cdb);
        memcpy(pvVar4,pcVar3,(long)local_14);
      }
      local_79 = 1;
    }
    else {
      fprintf(_stderr,"ModelBin read int8_weights failed %zd",local_20);
      fprintf(_stderr,"\n");
      ncnn::Mat::Mat(in_RDI);
    }
    local_58 = 1;
    std::vector<signed_char,_std::allocator<signed_char>_>::~vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_fffffffffffff990);
    return in_RDI;
  }
  if (local_24 == 0x2c056) {
    ncnn::Mat::Mat(in_stack_fffffffffffff990,_w,(size_t)in_stack_fffffffffffff980,
                   in_stack_fffffffffffff978);
    bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff980);
    if (bVar1) {
      ncnn::Mat::Mat(in_RDI,&local_c0);
    }
    else {
      plVar8 = *(long **)(in_RSI + 8);
      pvVar4 = ncnn::Mat::operator_cast_to_void_(&local_c0);
      local_20 = (**(code **)(*plVar8 + 0x18))(plVar8,pvVar4,(long)local_14 << 2);
      if (local_20 == (long)local_14 * 4) {
        ncnn::Mat::Mat(in_RDI,&local_c0);
      }
      else {
        fprintf(_stderr,"ModelBin read weight_data failed %zd",local_20);
        fprintf(_stderr,"\n");
        ncnn::Mat::Mat(in_RDI);
      }
    }
    local_58 = 1;
    ncnn::Mat::~Mat((Mat *)0x165ef3);
    return in_RDI;
  }
  ncnn::Mat::Mat(in_stack_fffffffffffff990,_w,(size_t)in_stack_fffffffffffff980,
                 in_stack_fffffffffffff978);
  bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff980);
  if (bVar1) {
    ncnn::Mat::Mat(in_RDI,&local_100);
    local_58 = 1;
    goto LAB_0016630c;
  }
  if (local_28 == 0) {
    if ((char)local_24 == '\0') {
      plVar8 = *(long **)(in_RSI + 8);
      pvVar4 = ncnn::Mat::operator_cast_to_void_(&local_100);
      local_20 = (**(code **)(*plVar8 + 0x18))(plVar8,pvVar4,(long)local_14 << 2);
      if (local_20 != (long)local_14 * 4) {
        fprintf(_stderr,"ModelBin read weight_data failed %zd",local_20);
        fprintf(_stderr,"\n");
        ncnn::Mat::Mat(in_RDI);
        local_58 = 1;
        goto LAB_0016630c;
      }
    }
  }
  else {
    local_20 = (**(code **)(**(long **)(in_RSI + 8) + 0x18))(*(long **)(in_RSI + 8),local_508,0x400)
    ;
    if (local_20 != 0x400) {
      fprintf(_stderr,"ModelBin read quantization_value failed %zd",local_20);
      fprintf(_stderr,"\n");
      ncnn::Mat::Mat(in_RDI);
      local_58 = 1;
      goto LAB_0016630c;
    }
    local_510 = ncnn::alignSize((long)local_14,4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x166063);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0),
               in_stack_fffffffffffff998);
    plVar8 = *(long **)(in_RSI + 8);
    puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x166095);
    local_20 = (**(code **)(*plVar8 + 0x18))(plVar8,puVar5,local_510);
    if (local_20 == local_510) {
      local_530 = ncnn::Mat::operator_cast_to_float_(&local_100);
      for (local_534 = 0; local_534 < local_14; local_534 = local_534 + 1) {
        pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&local_528,(long)local_534);
        local_530[local_534] = local_508[*pbVar6];
      }
      local_58 = 0;
    }
    else {
      fprintf(_stderr,"ModelBin read index_array failed %zd",local_20);
      fprintf(_stderr,"\n");
      ncnn::Mat::Mat(in_RDI);
      local_58 = 1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff990);
    if (local_58 != 0) goto LAB_0016630c;
  }
  ncnn::Mat::Mat(in_RDI,&local_100);
  local_58 = 1;
LAB_0016630c:
  ncnn::Mat::~Mat((Mat *)0x166319);
  return in_RDI;
}

Assistant:

Mat ModelBinFromDataReader::load(int w, int type) const
{
    if (type == 0)
    {
        size_t nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = dr.read(&flag_struct, sizeof(flag_struct));
        if (nread != sizeof(flag_struct))
        {
            NCNN_LOGE("ModelBin read flag_struct failed %zd", nread);
            return Mat();
        }

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            size_t align_data_size = alignSize(w * sizeof(unsigned short), 4);
            std::vector<unsigned short> float16_weights;
            float16_weights.resize(align_data_size);
            nread = dr.read(float16_weights.data(), align_data_size);
            if (nread != align_data_size)
            {
                NCNN_LOGE("ModelBin read float16_weights failed %zd", nread);
                return Mat();
            }

            return Mat::from_float16(float16_weights.data(), w);
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            size_t align_data_size = alignSize(w, 4);
            std::vector<signed char> int8_weights;
            int8_weights.resize(align_data_size);
            nread = dr.read(int8_weights.data(), align_data_size);
            if (nread != align_data_size)
            {
                NCNN_LOGE("ModelBin read int8_weights failed %zd", nread);
                return Mat();
            }

            Mat m(w, (size_t)1u);
            if (m.empty())
                return m;

            memcpy(m.data, int8_weights.data(), w);

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            Mat m(w);
            if (m.empty())
                return m;

            // raw data with extra scaling
            nread = dr.read(m, w * sizeof(float));
            if (nread != w * sizeof(float))
            {
                NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                return Mat();
            }

            return m;
        }

        Mat m(w);
        if (m.empty())
            return m;

        if (flag != 0)
        {
            // quantized data
            float quantization_value[256];
            nread = dr.read(quantization_value, 256 * sizeof(float));
            if (nread != 256 * sizeof(float))
            {
                NCNN_LOGE("ModelBin read quantization_value failed %zd", nread);
                return Mat();
            }

            size_t align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = dr.read(index_array.data(), align_weight_data_size);
            if (nread != align_weight_data_size)
            {
                NCNN_LOGE("ModelBin read index_array failed %zd", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[ index_array[i] ];
            }
        }
        else if (flag_struct.f0 == 0)
        {
            // raw data
            nread = dr.read(m, w * sizeof(float));
            if (nread != w * sizeof(float))
            {
                NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                return Mat();
            }
        }

        return m;
    }
    else if (type == 1)
    {
        Mat m(w);
        if (m.empty())
            return m;

        // raw data
        size_t nread = dr.read(m, w * sizeof(float));
        if (nread != w * sizeof(float))
        {
            NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
            return Mat();
        }

        return m;
    }
    else
    {
        NCNN_LOGE("ModelBin load type %d not implemented", type);
        return Mat();
    }

    return Mat();
}